

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBGlobalBufferTest *this,GLuint test_case_index)

{
  pointer p_Var1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  Utils::Shader::GetStageName(p_Var1->m_stage);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  Utils::Type::GetGLSLTypeName(&p_Var1->m_type);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBGlobalBufferTest::getTestCaseName(GLuint test_case_index)
{
	std::string		 name;
	const _testCase& test_case = m_test_cases[test_case_index];

	name = "Tested stage: ";
	name.append(Utils::Shader::GetStageName(test_case.m_stage));
	name.append(". Tested type: ");
	name.append(test_case.m_type.GetGLSLTypeName());

	return name;
}